

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

char * __thiscall doctest::String::allocate(String *this,uint sz)

{
  String *pSVar1;
  
  if (sz < 0x18) {
    (this->field_0).buf[sz] = '\0';
    (this->field_0).buf[0x17] = '\x17' - (char)sz;
    pSVar1 = this;
  }
  else {
    (this->field_0).buf[0x17] = -0x80;
    (this->field_0).data.size = sz;
    (this->field_0).data.capacity = sz + 1;
    pSVar1 = (String *)operator_new__((ulong)(sz + 1));
    (this->field_0).data.ptr = (char *)pSVar1;
    (pSVar1->field_0).buf[sz] = '\0';
  }
  return (char *)pSVar1;
}

Assistant:

char* String::allocate(unsigned sz) {
    if (sz <= last) {
        buf[sz] = '\0';
        setLast(last - sz);
        return buf;
    } else {
        setOnHeap();
        data.size = sz;
        data.capacity = data.size + 1;
        data.ptr = new char[data.capacity];
        data.ptr[sz] = '\0';
        return data.ptr;
    }
}